

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parsePostIncDec(StructuralParser *this,Expression *lhs,bool isIncrement)

{
  PreOrPostIncOrDec *pPVar1;
  bool local_39;
  Context local_38;
  bool local_19;
  Expression *pEStack_18;
  bool isIncrement_local;
  Expression *lhs_local;
  StructuralParser *this_local;
  
  local_19 = isIncrement;
  pEStack_18 = lhs;
  lhs_local = (Expression *)this;
  getContext(&local_38,this);
  local_39 = true;
  pPVar1 = allocate<soul::AST::PreOrPostIncOrDec,soul::AST::Context,soul::AST::Expression&,bool&,bool>
                     (this,&local_38,pEStack_18,&local_19,&local_39);
  AST::Context::~Context(&local_38);
  return &pPVar1->super_Expression;
}

Assistant:

AST::Expression& parsePostIncDec (AST::Expression& lhs, bool isIncrement)
    {
        return allocate<AST::PreOrPostIncOrDec> (getContext(), lhs, isIncrement, true);
    }